

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O1

void __thiscall JsrtDebugManager::~JsrtDebugManager(JsrtDebugManager *this)

{
  JsrtDebuggerObjectsManager *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  JsrtDebugDocumentManager *this_01;
  Recycler *this_02;
  ArenaData *local_28;
  
  (this->super_HaltCallback)._vptr_HaltCallback = (_func_int **)&PTR_CanHalt_014e4d78;
  (this->super_DebuggerOptionsCallback)._vptr_DebuggerOptionsCallback =
       (_func_int **)&PTR_IsExceptionReportingEnabled_014e4de8;
  (this->super_HostDebugContext)._vptr_HostDebugContext = (_func_int **)&PTR_Delete_014e4e18;
  this_00 = this->debuggerObjectsManager;
  if (this_00 != (JsrtDebuggerObjectsManager *)0x0) {
    pAVar1 = &this->debugObjectArena->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    JsrtDebuggerObjectsManager::~JsrtDebuggerObjectsManager(this_00);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (pAVar1,this_00,0x20);
    this->debuggerObjectsManager = (JsrtDebuggerObjectsManager *)0x0;
  }
  this_01 = this->debugDocumentManager;
  if (this_01 != (JsrtDebugDocumentManager *)0x0) {
    pAVar1 = &this->debugObjectArena->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    JsrtDebugDocumentManager::~JsrtDebugDocumentManager(this_01);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (pAVar1,this_01,0x10);
    this->debugDocumentManager = (JsrtDebugDocumentManager *)0x0;
  }
  if (this->debugObjectArena != (ArenaAllocator *)0x0) {
    this_02 = this->threadContext->recycler;
    local_28 = &(this->debugObjectArena->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                super_ArenaData;
    DListBase<Memory::ArenaData_*,_RealCount>::Remove<Memory::NoThrowHeapAllocator>
              (&this_02->externalGuestArenaList,
               (NoThrowHeapAllocator *)&Memory::NoThrowHeapAllocator::Instance,&local_28);
    Memory::Recycler::CollectNow<(Memory::CollectionFlags)8320>(this_02);
    pAVar1 = &this->debugObjectArena->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
              (pAVar1);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,pAVar1,0x80);
    this->debugObjectArena = (ArenaAllocator *)0x0;
  }
  this->threadContext = (ThreadContext *)0x0;
  this->debugEventCallback = (JsDiagDebugEventCallback)0x0;
  this->callbackState = (void *)0x0;
  return;
}

Assistant:

JsrtDebugManager::~JsrtDebugManager()
{
    if (this->debuggerObjectsManager != nullptr)
    {
        Adelete(this->debugObjectArena, this->debuggerObjectsManager);
        this->debuggerObjectsManager = nullptr;
    }

    if (this->debugDocumentManager != nullptr)
    {
        Adelete(this->debugObjectArena, this->debugDocumentManager);
        this->debugDocumentManager = nullptr;
    }

    if (this->debugObjectArena != nullptr)
    {
        this->threadContext->GetRecycler()->UnregisterExternalGuestArena(this->debugObjectArena);
        HeapDelete(this->debugObjectArena);
        this->debugObjectArena = nullptr;
    }

    this->debugEventCallback = nullptr;
    this->callbackState = nullptr;
    this->threadContext = nullptr;
}